

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl-int-reader.hpp
# Opt level: O3

int64_t yactfr::internal::anon_unknown_0::readFlSIntBe40At1(uint8_t *buf)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  
  uVar3 = (ulong)((uint)buf[2] | (uint)buf[1] << 8 | (*buf & 0x7f) << 0x10) << 0x11;
  uVar2 = ((uint)(buf[5] >> 7) | (uint)buf[3] * 0x200 + (uint)buf[4] * 2) | uVar3;
  uVar1 = uVar2 | 0xffffff0000000000;
  if (uVar3 >> 0x27 == 0) {
    uVar1 = uVar2;
  }
  return uVar1;
}

Assistant:

std::int64_t readFlSIntBe40At1(const std::uint8_t * const buf) {
    std::uint64_t res = 0;

    res |= buf[0];
    res <<= 8;
    res |= buf[1];
    res <<= 8;
    res |= buf[2];
    res <<= 8;
    res |= buf[3];
    res <<= 8;
    res |= buf[4];
    res <<= 1;
    res |= (buf[5] >> 7);
    res &= UINT64_C(0xffffffffff);

    if (res >> 39) {
        res |= UINT64_C(0xffffff0000000000);
    }

    return static_cast<std::int64_t>(res);
}